

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onExitBuiltInFunctionInvocationExpressionAstNode
          (CompilerAstWalker *this,BuiltInFunctionInvocationExpressionAstNode *node)

{
  iterator iVar1;
  string local_40;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->builtInFunctionLookup)._M_h,
                 &((node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->value);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "onExitBuiltInFunctionInvocationExpressionAstNode found a built in function it does not know about"
             ,"");
  Error::assertWithPanic
            (iVar1.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_true>
             ._M_cur != (__node_type *)0x0,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  emit(this,*(ByteCodeInstruction *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_true>
                    ._M_cur + 0x28));
  return;
}

Assistant:

void onExitBuiltInFunctionInvocationExpressionAstNode(BuiltInFunctionInvocationExpressionAstNode* node) noexcept override {
    auto find = this->builtInFunctionLookup.find(node->identifier->value);

    Error::assertWithPanic(
      find != this->builtInFunctionLookup.end(),
      "onExitBuiltInFunctionInvocationExpressionAstNode found a built in function it does not know about");

    this->emit(find->second);
  }